

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O0

int raplcap_pd_set_zone_enabled(raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone,int enabled)

{
  int iVar1;
  raplcap_msr *ctx;
  off_t msr_00;
  int ret;
  off_t msr;
  raplcap_msr *state;
  uint64_t msrval;
  int enabled_local;
  raplcap_zone zone_local;
  uint32_t die_local;
  uint32_t pkg_local;
  raplcap *rc_local;
  
  msrval._0_4_ = enabled;
  msrval._4_4_ = zone;
  enabled_local = die;
  zone_local = pkg;
  _die_local = rc;
  ctx = get_state(rc,pkg,die);
  msr_00 = zone_to_msr_offset(msrval._4_4_,ZONE_OFFSETS_PL);
  if (((ctx == (raplcap_msr *)0x0) || (msr_00 < 0)) ||
     (iVar1 = msr_sys_read(ctx->sys,(uint64_t *)&state,zone_local,0,msr_00), iVar1 != 0)) {
    rc_local._4_4_ = -1;
  }
  else {
    state = (raplcap_msr *)
            msr_set_zone_enabled
                      (&ctx->ctx,msrval._4_4_,(uint64_t)state,(int *)&msrval,(int *)&msrval);
    rc_local._4_4_ = msr_sys_write(ctx->sys,(uint64_t)state,zone_local,enabled_local,msr_00);
    if (rc_local._4_4_ == 0) {
      state = (raplcap_msr *)
              msr_set_zone_clamped
                        (&ctx->ctx,msrval._4_4_,(uint64_t)state,(int *)&msrval,(int *)&msrval);
      msr_sys_write(ctx->sys,(uint64_t)state,zone_local,enabled_local,msr_00);
    }
  }
  return rc_local._4_4_;
}

Assistant:

int raplcap_pd_set_zone_enabled(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone, int enabled) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  int ret;
  raplcap_log(DEBUG, "raplcap_pd_set_zone_enabled: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, 0, msr)) {
    return -1;
  }
  msrval = msr_set_zone_enabled(&state->ctx, zone, msrval, &enabled, &enabled);
  if ((ret = msr_sys_write(state->sys, msrval, pkg, die, msr)) == 0) {
    // try to clamp (not supported by all zones or all CPUs)
    msrval = msr_set_zone_clamped(&state->ctx, zone, msrval, &enabled, &enabled);
    if (msr_sys_write(state->sys, msrval, pkg, die, msr)) {
      raplcap_log(INFO, "Clamping not available for this zone or platform\n");
    }
  }
  return ret;
}